

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O3

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  double dVar5;
  long lVar6;
  int iVar7;
  Rnm_Man_t *p_00;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  
  pVVar3 = p->pGia->vMapping;
  dVar13 = 0.0;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    iVar1 = pVVar3->nCap;
    auVar11._8_4_ = iVar1 >> 0x1f;
    auVar11._0_8_ = (long)iVar1;
    auVar11._12_4_ = 0x45300000;
    dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar8 = sat_solver2_memory(p->pSat,1);
  dVar9 = sat_solver2_memory_proof(p->pSat);
  pVVar4 = p->vId2Lit;
  dVar24 = 0.0;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar7 = pVVar4->nCap;
    auVar12._8_4_ = iVar7 >> 0x1f;
    auVar12._0_8_ = (long)iVar7;
    auVar12._12_4_ = 0x45300000;
    dVar24 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 8.0 + 16.0;
    if (0 < (long)pVVar4->nSize) {
      lVar6 = 0;
      do {
        if ((int *)pVVar4->pArray[lVar6] != (int *)0x0) {
          iVar7 = *pVVar4->pArray[lVar6];
          auVar20._8_4_ = iVar7 >> 0x1f;
          auVar20._0_8_ = (long)iVar7;
          auVar20._12_4_ = 0x45300000;
          dVar24 = dVar24 + ((auVar20._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        lVar6 = lVar6 + 1;
      } while (pVVar4->nSize != lVar6);
    }
  }
  p_00 = p->pRnm;
  dVar10 = Rnm_ManMemoryUsage(p_00);
  iVar7 = (int)p_00;
  pVVar4 = p->vCnfs;
  dVar14 = 0.0;
  dVar30 = 0.0;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar4->nCap;
    auVar17._8_4_ = iVar2 >> 0x1f;
    auVar17._0_8_ = (long)iVar2;
    auVar17._12_4_ = 0x45300000;
    dVar30 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0;
    if (0 < (long)pVVar4->nSize) {
      lVar6 = 0;
      do {
        if ((int *)pVVar4->pArray[lVar6] != (int *)0x0) {
          iVar2 = *pVVar4->pArray[lVar6];
          auVar26._8_4_ = iVar2 >> 0x1f;
          auVar26._0_8_ = (long)iVar2;
          auVar26._12_4_ = 0x45300000;
          dVar30 = dVar30 + ((auVar26._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
        }
        lVar6 = lVar6 + 1;
      } while (pVVar4->nSize != lVar6);
    }
  }
  if (p->vIds != (Vec_Int_t *)0x0) {
    iVar2 = p->vIds->nCap;
    auVar18._8_4_ = iVar2 >> 0x1f;
    auVar18._0_8_ = (long)iVar2;
    auVar18._12_4_ = 0x45300000;
    dVar14 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar16 = 0.0;
  dVar5 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    iVar2 = p->vProofIds->nCap;
    auVar21._8_4_ = iVar2 >> 0x1f;
    auVar21._0_8_ = (long)iVar2;
    auVar21._12_4_ = 0x45300000;
    dVar5 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    iVar2 = p->vAbs->nCap;
    auVar22._8_4_ = iVar2 >> 0x1f;
    auVar22._0_8_ = (long)iVar2;
    auVar22._12_4_ = 0x45300000;
    dVar16 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar19 = 0.0;
  dVar23 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    iVar2 = p->vValues->nCap;
    auVar27._8_4_ = iVar2 >> 0x1f;
    auVar27._0_8_ = (long)iVar2;
    auVar27._12_4_ = 0x45300000;
    dVar23 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    iVar2 = p->vLits->nCap;
    auVar28._8_4_ = iVar2 >> 0x1f;
    auVar28._0_8_ = (long)iVar2;
    auVar28._12_4_ = 0x45300000;
    dVar19 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  dVar25 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    iVar2 = p->vIsopMem->nCap;
    auVar29._8_4_ = iVar2 >> 0x1f;
    auVar29._0_8_ = (long)iVar2;
    auVar29._12_4_ = 0x45300000;
    dVar25 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0;
  }
  lVar6 = (long)p->nTable * 0x18;
  auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar15._0_8_ = lVar6;
  auVar15._12_4_ = 0x45300000;
  dVar13 = (double)iVar1 * 12.0 + dVar13;
  dVar9 = (auVar15._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
          dVar10 + dVar24 + dVar9 + dVar8 + dVar13 +
          dVar25 + dVar19 + dVar23 + dVar16 + dVar30 + 224.0 + dVar14 + dVar5 + 926274.0;
  Abc_Print(iVar7,"%s =","Memory: AIG      ");
  dVar8 = (dVar13 * 100.0) / dVar9;
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    dVar8 = 0.0;
  }
  dVar24 = (dVar9 * 100.0) / dVar9;
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    dVar24 = 0.0;
  }
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n",dVar13 * 9.5367431640625e-07,dVar8);
  Abc_Print(iVar7,"%s =","Memory: SAT      ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: Proof    ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: Map      ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: Refine   ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: Hash     ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: Other    ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n");
  Abc_Print(iVar7,"%s =","Memory: TOTAL    ");
  Abc_Print(iVar7,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,dVar24);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}